

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultVoice(TgTypeParser *this,ptree *data)

{
  type_conflict4 tVar1;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  path_type pStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::make_shared<TgBot::InlineQueryResultVoice>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"voice_url",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_38,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&pStack_68);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xa8),(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&pStack_68);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"voice_duration",0x2e);
  local_38._M_dataplus._M_p._0_4_ = 0;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&pStack_68,(int *)&local_38);
  *(type_conflict4 *)(*(long *)this + 200) = tVar1;
  std::__cxx11::string::~string((string *)&pStack_68);
  PVar2.super___shared_ptr<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQueryResultVoice::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultVoice(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultVoice>());
    result->voiceUrl = data.get<string>("voice_url");
    result->voiceDuration = data.get<int32_t>("voice_duration", 0);
    return result;
}